

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBuffer.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLBufferFullHandler::XMLBufferFullHandler(XMLBufferFullHandler *this)

{
  XMLBufferFullHandler *this_local;
  
  this->_vptr_XMLBufferFullHandler = (_func_int **)&PTR__XMLBufferFullHandler_00530170;
  return;
}

Assistant:

class XMLPARSER_EXPORT XMLBufferFullHandler
{
public :

    virtual ~XMLBufferFullHandler() {}

    /**
     * Callback method, intended to allow clients of an XMLBuffer which has
     * become full to empty it appropriately.
     * @return true if the handler was able to empty the buffer (either
     * partially or completely), otherwise false to indicate an error.
     */
    virtual bool bufferFull(XMLBuffer&) = 0;

}